

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_uv.cc
# Opt level: O1

int UVScale(uint8_t *src_uv,int src_stride_uv,int src_width,int src_height,uint8_t *dst_uv,
           int dst_stride_uv,int dst_width,int dst_height,FilterMode filtering)

{
  uint uVar1;
  ulong uVar2;
  FilterMode filtering_00;
  uint uVar3;
  code *pcVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  code *pcVar12;
  uint8_t *puVar13;
  code *pcVar14;
  uint uVar15;
  ulong uVar16;
  int y;
  ulong local_b0;
  uint8_t *local_a8;
  ulong local_a0;
  int x;
  code *local_90;
  long local_88;
  ulong local_80;
  ulong local_78;
  code *local_70;
  code *local_68;
  code *local_60;
  code *local_58;
  uint local_50;
  int local_4c;
  uint local_48;
  int dx;
  long local_40;
  code *local_38;
  
  if (dst_height < 1) {
    return -1;
  }
  if (dst_width < 1) {
    return -1;
  }
  if (dst_uv == (uint8_t *)0x0) {
    return -1;
  }
  if (0x8000 < src_height) {
    return -1;
  }
  if (0x8000 < src_width) {
    return -1;
  }
  if (src_uv == (uint8_t *)0x0) {
    return -1;
  }
  if (src_width == 0) {
    return -1;
  }
  if (src_height == 0) {
    return -1;
  }
  x = 0;
  y = 0;
  dx = 0;
  local_48 = 0;
  filtering_00 = ScaleFilterReduce(src_width,src_height,dst_width,dst_height,filtering);
  if (src_height < 0) {
    iVar10 = -src_height;
    local_a8 = src_uv + ~src_height * src_stride_uv;
    local_b0 = CONCAT44(local_b0._4_4_,-src_stride_uv);
  }
  else {
    local_b0 = CONCAT44(local_b0._4_4_,src_stride_uv);
    iVar10 = src_height;
    local_a8 = src_uv;
  }
  local_88 = CONCAT44(local_88._4_4_,iVar10);
  ScaleSlope(src_width,iVar10,dst_width,dst_height,filtering_00,&x,&y,&dx,(int *)&local_48);
  iVar10 = dx;
  uVar3 = local_48;
  puVar13 = local_a8;
  uVar15 = y;
  uVar16 = (ulong)(uint)-src_width;
  if (0 < src_width) {
    uVar16 = (ulong)(uint)src_width;
  }
  local_80 = (ulong)dx;
  local_a0 = (ulong)local_48;
  if ((short)(local_48 | dx) == 0) {
    if (local_48 == 0 || dx == 0) {
      filtering_00 = kFilterNone;
    }
    else {
      uVar5 = x >> 0xf;
      if (((local_48 | dx) >> 0x10 & 1) == 0) {
        if (dx == 0x20000) {
          if (filtering_00 == kFilterLinear) {
            pcVar14 = ScaleUVRowDown2Linear_C;
          }
          else {
            pcVar14 = ScaleUVRowDown2Box_C;
          }
          if (filtering_00 == kFilterNone) {
            pcVar14 = ScaleUVRowDown2_C;
          }
          uVar15 = (uVar5 & 0xfffffffe) - 2;
          if (filtering_00 == kFilterBilinear) {
            uVar15 = uVar5 & 0xfffffffe;
          }
          iVar10 = (int)y._2_2_;
          uVar3 = cpu_info_;
          if (cpu_info_ == 0) {
            uVar3 = InitCpuFlags();
          }
          if ((dst_width & 3U) == 0) {
            pcVar12 = ScaleUVRowDown2Box_SSSE3;
          }
          else {
            pcVar12 = ScaleUVRowDown2Box_Any_SSSE3;
          }
          if ((uVar3 & 0x40) == 0) {
            pcVar12 = pcVar14;
          }
          if (filtering_00 == kFilterNone) {
            pcVar12 = pcVar14;
          }
          uVar3 = cpu_info_;
          if (cpu_info_ == 0) {
            uVar3 = InitCpuFlags();
          }
          if ((dst_width & 7U) == 0) {
            pcVar14 = ScaleUVRowDown2Box_AVX2;
          }
          else {
            pcVar14 = ScaleUVRowDown2Box_Any_AVX2;
          }
          if ((uVar3 & 0x400) == 0) {
            pcVar14 = pcVar12;
          }
          if (filtering_00 == kFilterNone) {
            pcVar14 = pcVar12;
          }
          if (dst_height < 1) {
            return 0;
          }
          puVar13 = local_a8 + (int)(iVar10 * (int)local_b0 + uVar15);
          iVar10 = 0;
          if (filtering_00 != kFilterLinear) {
            iVar10 = (int)local_b0;
          }
          local_a0 = (ulong)(((int)local_a0 >> 0x10) * (int)local_b0);
          do {
            (*pcVar14)(puVar13,(long)iVar10,dst_uv,dst_width);
            puVar13 = puVar13 + local_a0;
            dst_uv = dst_uv + dst_stride_uv;
            dst_height = dst_height + -1;
          } while (dst_height != 0);
          return 0;
        }
        if (filtering_00 != kFilterBox || dx != 0x40000) {
          if (filtering_00 == kFilterNone) {
            pcVar14 = ScaleUVRowDownEven_C;
          }
          else {
            pcVar14 = ScaleUVRowDownEvenBox_C;
          }
          if (dst_height < 1) {
            return 0;
          }
          local_80 = (ulong)(uint)(dx >> 0x10);
          iVar10 = 0;
          if (filtering_00 != kFilterLinear) {
            iVar10 = (int)local_b0;
          }
          puVar13 = local_a8 + (int)((uVar5 & 0xfffffffe) + y._2_2_ * (int)local_b0);
          local_a0 = (ulong)(((int)local_48 >> 0x10) * (int)local_b0);
          do {
            (*pcVar14)(puVar13,(long)iVar10,local_80,dst_uv,dst_width);
            puVar13 = puVar13 + local_a0;
            dst_uv = dst_uv + dst_stride_uv;
            dst_height = dst_height + -1;
          } while (dst_height != 0);
          return 0;
        }
        iVar10 = (int)y._2_2_;
        uVar3 = dst_width * 4 + 0xfU & 0xfffffff0;
        local_70 = (code *)malloc((ulong)(uVar3 * 2 + 0x3f));
        uVar15 = cpu_info_;
        if (cpu_info_ == 0) {
          uVar15 = InitCpuFlags();
        }
        if ((dst_width & 3U) == 0) {
          pcVar14 = ScaleUVRowDown2Box_SSSE3;
        }
        else {
          pcVar14 = ScaleUVRowDown2Box_Any_SSSE3;
        }
        if ((uVar15 & 0x40) == 0) {
          pcVar14 = ScaleUVRowDown2Box_C;
        }
        uVar15 = cpu_info_;
        if (cpu_info_ == 0) {
          uVar15 = InitCpuFlags();
        }
        if ((dst_width & 7U) == 0) {
          pcVar12 = ScaleUVRowDown2Box_AVX2;
        }
        else {
          pcVar12 = ScaleUVRowDown2Box_Any_AVX2;
        }
        if ((uVar15 >> 10 & 1) == 0) {
          pcVar12 = pcVar14;
        }
        pcVar14 = local_70;
        if (0 < dst_height) {
          iVar6 = (int)local_a0;
          iVar11 = dst_width * 2;
          local_a0 = CONCAT44(local_a0._4_4_,iVar11);
          uVar16 = (ulong)(local_70 + 0x3f) & 0xffffffffffffffc0;
          puVar13 = local_a8 + (int)((uVar5 & 0xfffffffe) + iVar10 * (int)local_b0);
          pcVar4 = (code *)(long)(int)local_b0;
          local_78 = (ulong)((int)local_b0 * 2);
          local_a8 = (uint8_t *)(uVar3 + uVar16);
          local_80 = (ulong)((iVar6 >> 0x10) * (int)local_b0);
          local_68 = (code *)(long)dst_stride_uv;
          local_b0 = (ulong)uVar3;
          local_90 = pcVar4;
          do {
            (*pcVar12)(puVar13,pcVar4,uVar16,iVar11);
            (*pcVar12)(puVar13 + local_78,pcVar4,local_a8,iVar11);
            (*pcVar12)(uVar16,local_b0,dst_uv,dst_width);
            puVar13 = puVar13 + local_80;
            dst_uv = dst_uv + (long)local_68;
            dst_height = dst_height + -1;
            pcVar14 = local_70;
          } while (dst_height != 0);
        }
        goto LAB_0014f62f;
      }
      if ((((dx & local_48) >> 0x10 & 1) != 0) &&
         (filtering_00 = kFilterNone, local_48 == 0x10000 && dx == 0x10000)) {
        if (local_a8 == (uint8_t *)0x0) {
          return 0;
        }
        CopyPlane(local_a8 + (long)(y._2_2_ * (int)local_b0) + (long)(int)(uVar5 & 0xfffffffe),
                  (int)local_b0,dst_uv,dst_stride_uv,dst_width * 2,dst_height);
        return 0;
      }
    }
  }
  if ((dx == 0x10000) && ((short)x == 0)) {
    ScalePlaneVertical((int)local_88,dst_width,dst_height,(int)local_b0,dst_stride_uv,local_a8,
                       dst_uv,x,y,local_48,4,filtering_00);
    return 0;
  }
  local_78 = (ulong)x;
  uVar5 = (uint)uVar16;
  if ((int)local_48 < 0x10000 && filtering_00 != kFilterNone) {
    uVar3 = cpu_info_;
    if (cpu_info_ == 0) {
      uVar3 = InitCpuFlags();
    }
    if ((dst_width & 3U) == 0) {
      pcVar14 = InterpolateRow_SSSE3;
    }
    else {
      pcVar14 = InterpolateRow_Any_SSSE3;
    }
    if ((uVar3 & 0x40) == 0) {
      pcVar14 = InterpolateRow_C;
    }
    uVar3 = cpu_info_;
    if (cpu_info_ == 0) {
      uVar3 = InitCpuFlags();
    }
    if ((dst_width & 7U) == 0) {
      local_68 = InterpolateRow_AVX2;
    }
    else {
      local_68 = InterpolateRow_Any_AVX2;
    }
    uVar1 = (int)local_88 * 0x10000 - 0x10000;
    local_60 = (code *)CONCAT44(local_60._4_4_,uVar1);
    if ((uVar3 >> 10 & 1) == 0) {
      local_68 = pcVar14;
    }
    if (uVar5 < 0x8000) {
      local_58 = ScaleUVFilterCols_C;
    }
    else {
      local_58 = ScaleUVFilterCols64_C;
    }
    local_50 = uVar15;
    if ((int)uVar1 < (int)uVar15) {
      local_50 = uVar1;
    }
    iVar10 = (int)local_50 >> 0x10;
    iVar11 = iVar10 * (int)local_b0;
    uVar15 = dst_width * 2 + 0xfU & 0xfffffff0;
    local_90 = (code *)(puVar13 + iVar11);
    local_38 = (code *)malloc((ulong)(uVar15 * 2 + 0x3f));
    pcVar14 = local_58;
    pcVar12 = (code *)((ulong)(local_38 + 0x3f) & 0xffffffffffffffc0);
    (*local_58)(pcVar12,puVar13 + iVar11,dst_width,local_78,local_80);
    local_40 = (long)(int)local_b0;
    lVar9 = 0;
    if (1 < (int)local_88) {
      lVar9 = local_40;
    }
    puVar13 = (uint8_t *)(local_90 + lVar9);
    local_90 = pcVar12;
    local_70 = (code *)(ulong)uVar15;
    (*pcVar14)((code *)(ulong)uVar15 + (long)pcVar12,puVar13,dst_width,local_78,local_80);
    pcVar14 = local_38;
    if (0 < dst_height) {
      local_88 = CONCAT44(local_88._4_4_,dst_width * 2);
      puVar13 = puVar13 + local_40;
      local_4c = (int)(uint)local_60 >> 0x10;
      local_a8 = local_a8 + (int)local_b0 * local_4c;
      local_b0 = (ulong)dst_stride_uv;
      uVar15 = local_50;
      do {
        pcVar14 = local_90;
        if ((int)uVar15 >> 0x10 != iVar10) {
          iVar11 = (int)uVar15 >> 0x10;
          if ((int)(uint)local_60 < (int)uVar15) {
            puVar13 = local_a8;
            iVar11 = local_4c;
          }
          if ((int)(uint)local_60 <= (int)uVar15) {
            uVar15 = (uint)local_60;
          }
          if (iVar11 != iVar10) {
            (*local_58)(local_90,puVar13,dst_width,local_78,local_80);
            local_90 = pcVar14 + (int)local_70;
            local_70 = (code *)(ulong)(uint)-(int)local_70;
            puVar13 = puVar13 + local_40;
            iVar10 = iVar11;
          }
        }
        uVar16 = local_a0;
        if (filtering_00 == kFilterLinear) {
          lVar9 = 0;
          uVar3 = 0;
        }
        else {
          uVar3 = uVar15 >> 8 & 0xff;
          lVar9 = (long)(int)local_70;
        }
        (*local_68)(dst_uv,local_90,lVar9,(int)local_88,uVar3);
        dst_uv = dst_uv + local_b0;
        uVar15 = uVar15 + (int)uVar16;
        dst_height = dst_height + -1;
        pcVar14 = local_38;
      } while (dst_height != 0);
    }
  }
  else {
    if (filtering_00 == kFilterNone) {
      if (uVar5 < 0x8000) {
        pcVar14 = ScaleUVCols_C;
      }
      else {
        pcVar14 = ScaleUVCols64_C;
      }
      pcVar12 = pcVar14;
      if (x < 0x8000) {
        pcVar12 = ScaleUVColsUp2_C;
      }
      if (uVar5 * 2 == dst_width) {
        pcVar14 = pcVar12;
      }
      if (dst_height < 1) {
        return 0;
      }
      local_90 = (code *)(long)dst_stride_uv;
      iVar11 = y;
      do {
        (*pcVar14)(dst_uv,local_a8 + (iVar11 >> 0x10) * (int)local_b0,dst_width,local_78,iVar10);
        dst_uv = dst_uv + (long)local_90;
        iVar11 = iVar11 + uVar3;
        dst_height = dst_height + -1;
      } while (dst_height != 0);
      return 0;
    }
    if (uVar5 < 0x8000) {
      local_90 = ScaleUVFilterCols_C;
    }
    else {
      local_90 = ScaleUVFilterCols64_C;
    }
    uVar7 = (dst_width - 1) * local_80 + local_78;
    uVar8 = uVar7;
    uVar2 = local_78;
    if (dx < 0) {
      uVar8 = local_78;
      uVar2 = uVar7;
    }
    uVar7 = (long)uVar2 >> 0x10 & 0xfffffffffffffffc;
    uVar8 = ((long)uVar8 >> 0x10) + 5U & 0xfffffffffffffffc;
    if ((long)uVar16 <= (long)uVar8) {
      uVar8 = uVar16;
    }
    uVar5 = (int)uVar8 - (int)uVar7;
    uVar3 = cpu_info_;
    if (cpu_info_ == 0) {
      uVar3 = InitCpuFlags();
    }
    if ((uVar5 & 7) == 0) {
      pcVar14 = InterpolateRow_SSSE3;
    }
    else {
      pcVar14 = InterpolateRow_Any_SSSE3;
    }
    if ((uVar3 & 0x40) == 0) {
      pcVar14 = InterpolateRow_C;
    }
    uVar3 = cpu_info_;
    if (cpu_info_ == 0) {
      uVar3 = InitCpuFlags();
    }
    if ((uVar5 & 0xf) == 0) {
      local_70 = InterpolateRow_AVX2;
    }
    else {
      local_70 = InterpolateRow_Any_AVX2;
    }
    if ((uVar3 >> 10 & 1) == 0) {
      local_70 = pcVar14;
    }
    local_68 = (code *)(ulong)uVar5;
    pcVar14 = (code *)malloc((long)(int)(uVar5 * 4 + 0x3f));
    local_60 = pcVar14;
    if (0 < dst_height) {
      local_68 = (code *)(ulong)(uint)((int)local_68 * 2);
      local_a8 = local_a8 + uVar7 * 2;
      local_78 = (ulong)((int)local_78 + ((uint)(uVar2 >> 0x10) & 0xfffffffc) * -0x10000);
      pcVar12 = pcVar14 + 0x3f;
      uVar3 = (int)local_88 * 0x10000 - 0x10000;
      if ((int)uVar3 < (int)uVar15) {
        uVar15 = uVar3;
      }
      local_88 = (long)(int)local_b0;
      do {
        puVar13 = local_a8 + ((int)uVar15 >> 0x10) * (int)local_b0;
        if (filtering_00 != kFilterLinear) {
          (*local_70)((uint8_t *)((ulong)pcVar12 & 0xffffffffffffffc0),
                      local_a8 + ((int)uVar15 >> 0x10) * (int)local_b0,local_88,local_68,
                      uVar15 >> 8 & 0xff);
          puVar13 = (uint8_t *)((ulong)pcVar12 & 0xffffffffffffffc0);
        }
        (*local_90)(dst_uv,puVar13,dst_width,local_78,local_80);
        dst_uv = dst_uv + dst_stride_uv;
        uVar15 = uVar15 + (int)local_a0;
        if ((int)uVar3 <= (int)uVar15) {
          uVar15 = uVar3;
        }
        dst_height = dst_height + -1;
        pcVar14 = local_60;
      } while (dst_height != 0);
    }
  }
LAB_0014f62f:
  free(pcVar14);
  return 0;
}

Assistant:

LIBYUV_API
int UVScale(const uint8_t* src_uv,
            int src_stride_uv,
            int src_width,
            int src_height,
            uint8_t* dst_uv,
            int dst_stride_uv,
            int dst_width,
            int dst_height,
            enum FilterMode filtering) {
  if (!src_uv || src_width == 0 || src_height == 0 || src_width > 32768 ||
      src_height > 32768 || !dst_uv || dst_width <= 0 || dst_height <= 0) {
    return -1;
  }
  ScaleUV(src_uv, src_stride_uv, src_width, src_height, dst_uv, dst_stride_uv,
          dst_width, dst_height, 0, 0, dst_width, dst_height, filtering);
  return 0;
}